

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseInputCommand(WastParser *this,CommandPtr *param_1)

{
  Result RVar1;
  Location loc;
  string text;
  Var var;
  string local_d0;
  Var local_b0;
  Var local_68;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ != Error) {
    GetToken((Token *)&local_b0,this);
    RVar1 = Expect(this,Input);
    if (RVar1.enum_ != Error) {
      Error(this,0x19a6bc);
      Var::Var(&local_b0);
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      Var::Var(&local_68);
      ParseVarOpt(this,&local_b0,&local_68);
      Var::~Var(&local_68);
      RVar1 = ParseQuotedText(this,&local_d0,true);
      if (RVar1.enum_ != Error) {
        Expect(this,Rpar);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      Var::~Var(&local_b0);
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInputCommand(CommandPtr*) {
  // Parse the input command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseInputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Input);
  Error(loc, "input command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  CHECK_RESULT(ParseQuotedText(&text));
  EXPECT(Rpar);
  return Result::Error;
}